

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_TestShell::createTest
          (TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_TestShell *this)

{
  Utest *this_00;
  TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x17f);
  TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test::
  TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test
            ((TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test *)
             this_00);
  return this_00;
}

Assistant:

TEST(MockParameterTest, expectOneMemBufferParameterAndValueFailsDueToSize)
{
    MockFailureReporterInstaller failureReporterInstaller;

    unsigned char memBuffer1[] = { 0x12, 0x15, 0xFF };
    unsigned char memBuffer2[] = { 0x12, 0x15, 0xFF, 0x90 };

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", memBuffer1, sizeof(memBuffer1));
    MockNamedValue parameter("parameter");
    parameter.setMemoryBuffer( memBuffer2, sizeof(memBuffer2) );
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", memBuffer1, sizeof(memBuffer1));
    mock().actualCall("foo").withParameter("parameter", memBuffer2, sizeof(memBuffer2));

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}